

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O0

Type dg::vr::Relations::negated(Type type)

{
  undefined4 in_EDI;
  Type local_4;
  
  switch(in_EDI) {
  case 0:
    local_4 = NE;
    break;
  case 1:
    local_4 = EQ;
    break;
  case 2:
    local_4 = SGT;
    break;
  case 3:
    local_4 = SGE;
    break;
  case 4:
    local_4 = UGT;
    break;
  case 5:
    local_4 = UGE;
    break;
  case 6:
    local_4 = SLT;
    break;
  case 7:
    local_4 = SLE;
    break;
  case 8:
    local_4 = ULT;
    break;
  case 9:
    local_4 = ULE;
    break;
  case 10:
  case 0xb:
  default:
    abort();
  }
  return local_4;
}

Assistant:

Relations::Type Relations::negated(Type type) {
    switch (type) {
    case EQ:
        return NE;
    case NE:
        return EQ;
    case SLE:
        return SGT;
    case SLT:
        return SGE;
    case ULE:
        return UGT;
    case ULT:
        return UGE;
    case SGE:
        return SLT;
    case SGT:
        return SLE;
    case UGE:
        return ULT;
    case UGT:
        return ULE;
    case PT:
    case PF:
        break;
    }
    assert(0 && "no negation for relation");
    abort();
}